

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preset.cpp
# Opt level: O2

void __thiscall sf2cute::SFPreset::set_global_zone(SFPreset *this,SFPresetZone *global_zone)

{
  SFPresetZone *pSVar1;
  SFPresetZone *pSVar2;
  SFPreset *pSVar3;
  invalid_argument *this_00;
  SFPresetZone *local_20;
  
  if (global_zone->parent_preset_ == (SFPreset *)0x0) {
    SFPresetZone::set_parent_preset(global_zone,this);
    std::make_unique<sf2cute::SFPresetZone,sf2cute::SFPresetZone>
              ((SFPresetZone *)&stack0xffffffffffffffe0);
    pSVar2 = local_20;
    local_20 = (SFPresetZone *)0x0;
    pSVar1 = (this->global_zone_)._M_t.
             super___uniq_ptr_impl<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>
             ._M_t.
             super__Tuple_impl<0UL,_sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>
             .super__Head_base<0UL,_sf2cute::SFPresetZone_*,_false>._M_head_impl;
    (this->global_zone_)._M_t.
    super___uniq_ptr_impl<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>._M_t.
    super__Tuple_impl<0UL,_sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>.
    super__Head_base<0UL,_sf2cute::SFPresetZone_*,_false>._M_head_impl = pSVar2;
    if (pSVar1 != (SFPresetZone *)0x0) {
      (**(code **)((long)(pSVar1->super_SFZone)._vptr_SFZone + 8))();
      if (local_20 != (SFPresetZone *)0x0) {
        (**(code **)(*(_func_int **)local_20 + 8))();
      }
    }
  }
  else {
    pSVar3 = SFPresetZone::parent_preset(global_zone);
    if (pSVar3 != this) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (this_00,"Preset zone has already been owned by another preset.");
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
  }
  return;
}

Assistant:

void SFPreset::set_global_zone(SFPresetZone global_zone) {
  // Check the parent preset of the zone.
  if (global_zone.has_parent_preset()) {
    if (&global_zone.parent_preset() == this) {
      // If the zone is already be owned by this preset, do nothing.
      return;
    }
    else {
      // Otherwise raise an error. A zone cannot be shared by two parents.
      throw std::invalid_argument("Preset zone has already been owned by another preset.");
    }
  }

  // Set this preset to the parent preset of the zone.
  global_zone.set_parent_preset(*this);

  // Set the global zone to this preset.
  global_zone_ = std::make_unique<SFPresetZone>(std::move(global_zone));
}